

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmJSONHelpers.h
# Opt level: O0

Object<cmCTestResourceSpec> * __thiscall
cmJSONHelperBuilder::Object<cmCTestResourceSpec>::BindPrivate
          (Object<cmCTestResourceSpec> *this,string_view *name,MemberFunction *func,bool required)

{
  undefined1 auStack_68 [8];
  Member m;
  bool required_local;
  MemberFunction *func_local;
  string_view *name_local;
  Object<cmCTestResourceSpec> *this_local;
  
  Member::Member((Member *)auStack_68);
  auStack_68 = (undefined1  [8])name->_M_len;
  m.Name._M_len = (size_t)name->_M_str;
  std::function<bool_(cmCTestResourceSpec_&,_const_Json::Value_*,_cmJSONState_*)>::operator=
            ((function<bool_(cmCTestResourceSpec_&,_const_Json::Value_*,_cmJSONState_*)> *)
             &m.Name._M_str,func);
  m.Function._M_invoker._0_1_ = required;
  std::
  vector<cmJSONHelperBuilder::Object<cmCTestResourceSpec>::Member,_std::allocator<cmJSONHelperBuilder::Object<cmCTestResourceSpec>::Member>_>
  ::push_back(&this->Members,(Member *)auStack_68);
  if (required) {
    this->AnyRequired = true;
  }
  Member::~Member((Member *)auStack_68);
  return this;
}

Assistant:

Object& BindPrivate(const cm::string_view& name, MemberFunction&& func,
                        bool required)
    {
      Member m;
      m.Name = name;
      m.Function = std::move(func);
      m.Required = required;
      this->Members.push_back(std::move(m));
      if (required) {
        this->AnyRequired = true;
      }
      return *this;
    }